

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_volume(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  int64_t iVar1;
  int64_t to_consume;
  int64_t size;
  archive_entry_header_ustar *header;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  iVar1 = tar_atol((char *)((long)h + 0x7c),0xc);
  if (iVar1 < 0x100001) {
    *unconsumed = (iVar1 + 0x1ffU & 0xfffffffffffffe00) + *unconsumed;
    a_local._4_4_ = L'\0';
  }
  else {
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
header_volume(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	const struct archive_entry_header_ustar *header;
	int64_t size, to_consume;

	(void)a; /* UNUSED */
	(void)tar; /* UNUSED */
	(void)entry; /* UNUSED */

	header = (const struct archive_entry_header_ustar *)h;
	size = tar_atol(header->size, sizeof(header->size));
	if (size > (int64_t)pathname_limit) {
		return (ARCHIVE_FATAL);
	}
	to_consume = ((size + 511) & ~511);
	*unconsumed += to_consume;
	return (ARCHIVE_OK);
}